

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall Population::Population(Population *this,unsigned_long size)

{
  undefined1 local_80 [8];
  Chromosome chrom;
  int i;
  unsigned_long size_local;
  Population *this_local;
  
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector(&this->chromosomes);
  for (chrom.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      (ulong)(long)chrom.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < size;
      chrom.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           chrom.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    Chromosome::Chromosome((Chromosome *)local_80);
    Chromosome::createRandomTurnList((Chromosome *)local_80);
    Chromosome::process((Chromosome *)local_80);
    Chromosome::setId((Chromosome *)local_80);
    std::vector<Chromosome,_std::allocator<Chromosome>_>::push_back
              (&this->chromosomes,(value_type *)local_80);
    Chromosome::~Chromosome((Chromosome *)local_80);
  }
  return;
}

Assistant:

Population(unsigned long size) {

        for (int i = 0; i < size; i++){
            Chromosome chrom;
            chrom.createRandomTurnList();
            chrom.process();
            chrom.setId();
            chromosomes.push_back(std::move(chrom));
        }
    }